

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

size_t ZSTD_compressBlock_internal
                 (ZSTD_CCtx *zc,void *dst,size_t dstCapacity,void *src,size_t srcSize)

{
  ZSTD_matchState_t *ms;
  FSE_CTable *nextCTable;
  FSE_CTable *pFVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  U32 UVar4;
  ZSTD_strategy ZVar5;
  HUF_repeat HVar6;
  FSE_repeat FVar7;
  ZSTD_compressedBlockState_t *pZVar8;
  ZSTD_compressedBlockState_t *hufTable;
  BYTE *pBVar9;
  bool bVar10;
  size_t __n;
  ulong uVar11;
  long lVar12;
  size_t sVar13;
  byte *code;
  uint uVar14;
  FSE_repeat FVar15;
  int iVar16;
  int iVar17;
  U32 *pUVar18;
  ulong uVar19;
  byte *pbVar20;
  long lVar21;
  rawSeqStore_t *rawSeqStore;
  uint uVar22;
  BYTE *pBVar23;
  ulong uVar24;
  BYTE *istart;
  undefined8 uVar25;
  symbolEncodingType_e sVar26;
  FSE_CTable *__dest;
  undefined1 auVar27 [16];
  size_t sVar28;
  byte *local_188;
  U32 max;
  seqDef *local_168;
  ZSTD_compressedBlockState_t *local_160;
  U32 *local_158;
  FSE_CTable *local_150;
  BYTE *local_148;
  seqStore_t *local_140;
  ulong local_138;
  BYTE *local_130;
  BYTE *local_128;
  seqDef *local_120;
  undefined8 local_118;
  FSE_CTable *local_110;
  U32 count [53];
  
  if (srcSize < 7) {
    ZSTD_ldm_skipSequences(&zc->externSeqStore,srcSize,(zc->appliedParams).cParams.searchLength);
    return 0;
  }
  (zc->seqStore).lit = (zc->seqStore).litStart;
  (zc->seqStore).sequences = (zc->seqStore).sequencesStart;
  (zc->seqStore).longLengthID = 0;
  pZVar8 = (zc->blockState).prevCBlock;
  (zc->blockState).matchState.opt.symbolCosts = &pZVar8->entropy;
  uVar14 = (int)src - *(int *)&(zc->blockState).matchState.window.base;
  UVar4 = (zc->blockState).matchState.nextToUpdate;
  if (UVar4 + 0x180 < uVar14) {
    uVar22 = (uVar14 - UVar4) - 0x180;
    if (0xbf < uVar22) {
      uVar22 = 0xc0;
    }
    (zc->blockState).matchState.nextToUpdate = uVar14 - uVar22;
  }
  ms = &(zc->blockState).matchState;
  local_140 = &zc->seqStore;
  uVar14 = (zc->blockState).matchState.window.dictLimit;
  uVar22 = (zc->blockState).matchState.window.lowLimit;
  pUVar18 = ((zc->blockState).nextCBlock)->rep;
  lVar21 = 0;
  do {
    pUVar18[lVar21] = pZVar8->rep[lVar21];
    lVar21 = lVar21 + 1;
  } while (lVar21 != 3);
  if ((zc->externSeqStore).pos < (zc->externSeqStore).size) {
    rawSeqStore = &zc->externSeqStore;
LAB_00157511:
    __n = ZSTD_ldm_blockCompress
                    (rawSeqStore,ms,local_140,pUVar18,&(zc->appliedParams).cParams,src,srcSize,
                     (uint)(uVar22 < uVar14));
  }
  else {
    if ((zc->appliedParams).ldmParams.enableLdm != 0) {
      count[2] = 0;
      count[3] = 0;
      count[4] = 0;
      count[5] = 0;
      count._0_8_ = zc->ldmSequences;
      count._24_8_ = zc->maxNbLdmSequences;
      sVar13 = ZSTD_ldm_generateSequences
                         (&zc->ldmState,(rawSeqStore_t *)count,&(zc->appliedParams).ldmParams,src,
                          srcSize);
      if (0xffffffffffffff88 < sVar13) {
        return sVar13;
      }
      pUVar18 = ((zc->blockState).nextCBlock)->rep;
      rawSeqStore = (rawSeqStore_t *)count;
      goto LAB_00157511;
    }
    __n = (*ZSTD_selectBlockCompressor::blockCompressor[uVar22 < uVar14]
            [(zc->appliedParams).cParams.strategy])
                    (ms,local_140,pUVar18,&(zc->appliedParams).cParams,src,srcSize);
  }
  memcpy((zc->seqStore).lit,(void *)((long)src + (srcSize - __n)),__n);
  pBVar23 = (zc->seqStore).lit + __n;
  (zc->seqStore).lit = pBVar23;
  pZVar8 = (zc->blockState).prevCBlock;
  hufTable = (zc->blockState).nextCBlock;
  local_158 = zc->entropyWorkspace;
  uVar14 = (zc->appliedParams).cParams.windowLog;
  local_138 = (ulong)(uint)zc->bmi2;
  local_120 = (zc->seqStore).sequencesStart;
  local_148 = (zc->seqStore).ofCode;
  local_128 = (zc->seqStore).llCode;
  local_130 = (zc->seqStore).mlCode;
  local_168 = (zc->seqStore).sequences;
  pBVar9 = (zc->seqStore).litStart;
  ZVar5 = (zc->appliedParams).cParams.strategy;
  iVar17 = (zc->appliedParams).disableLiteralCompression;
  (hufTable->entropy).hufCTable_repeatMode = (pZVar8->entropy).hufCTable_repeatMode;
  uVar24 = (long)pBVar23 - (long)pBVar9;
  memcpy(hufTable,pZVar8,0x400);
  local_160 = pZVar8;
  if (iVar17 == 0) {
    HVar6 = (pZVar8->entropy).hufCTable_repeatMode;
    uVar19 = 0x3f;
    if (HVar6 == HUF_repeat_valid) {
      uVar19 = 6;
    }
    if (uVar24 <= uVar19) goto LAB_00157769;
    uVar19 = ((ulong)(0x3ff < uVar24) - (ulong)(uVar24 < 0x4000)) + 4;
    local_188 = (byte *)0xffffffffffffffba;
    sVar13 = dstCapacity - uVar19;
    if (uVar19 <= dstCapacity && sVar13 != 0) {
      local_150 = (FSE_CTable *)(uVar24 >> 6);
      count[0] = HVar6;
      bVar10 = uVar24 < 0x401 && ZVar5 < ZSTD_lazy;
      if (uVar19 == 3 && HVar6 == HUF_repeat_valid || uVar24 < 0x100) {
        uVar11 = HUF_compress1X_repeat
                           ((void *)((long)dst + uVar19),sVar13,pBVar9,uVar24,0xff,0xb,local_158,
                            0x1800,(HUF_CElt *)hufTable,count,(uint)bVar10,(int)local_138);
      }
      else {
        uVar11 = HUF_compress4X_repeat
                           ((void *)((long)dst + uVar19),sVar13,pBVar9,uVar24,0xff,0xb,local_158,
                            0x1800,(HUF_CElt *)hufTable,count,(uint)bVar10,(int)local_138);
      }
      uVar22 = 3 - (count[0] == 0);
      if (uVar11 < (uVar24 - (long)local_150) - 2 && uVar11 - 1 < 0xffffffffffffff88) {
        iVar17 = (int)uVar24;
        if (uVar11 == 1) {
          memcpy(hufTable,local_160,0x400);
          lVar21 = ((ulong)(0x1f < uVar24) + 1) - (ulong)(uVar24 < 0x1000);
          lVar12 = lVar21 + 1;
          if (lVar12 == 3) {
            *(uint *)dst = iVar17 << 4 | 0xd;
          }
          else if ((int)lVar12 == 2) {
            *(ushort *)dst = (ushort)(iVar17 << 4) | 5;
          }
          else {
            *(char *)dst = (char)uVar24 * '\b' + '\x01';
          }
          *(BYTE *)((long)dst + lVar12) = *pBVar9;
          local_188 = (byte *)(ulong)((int)lVar21 + 2);
        }
        else {
          if (count[0] == 0) {
            (hufTable->entropy).hufCTable_repeatMode = HUF_repeat_check;
          }
          iVar16 = (int)uVar11;
          if (uVar19 == 5) {
            *(uint *)dst = iVar16 * 0x400000 + iVar17 * 0x10 | uVar22 | 0xc;
            *(char *)((long)dst + 4) = (char)(uVar11 >> 10);
          }
          else if (uVar19 == 4) {
            *(uint *)dst = iVar16 * 0x40000 + iVar17 * 0x10 | uVar22 | 8;
          }
          else {
            iVar17 = iVar16 * 0x4000 +
                     ((uVar22 | iVar17 * 0x10 +
                                (uint)(uVar19 == 3 && HVar6 == HUF_repeat_valid || uVar24 < 0x100) *
                                4) ^ 4);
            *(short *)dst = (short)iVar17;
            *(char *)((long)dst + 2) = (char)((uint)iVar17 >> 0x10);
          }
          local_188 = (byte *)(uVar11 + uVar19);
        }
      }
      else {
        memcpy(hufTable,local_160,0x400);
        local_188 = (byte *)ZSTD_noCompressLiterals(dst,dstCapacity,pBVar9,uVar24);
      }
    }
  }
  else {
LAB_00157769:
    local_188 = (byte *)ZSTD_noCompressLiterals(dst,dstCapacity,pBVar9,uVar24);
  }
  uVar22 = ZSTD_isError((size_t)local_188);
  pZVar8 = local_160;
  code = local_188;
  if ((uVar22 == 0) &&
     (code = (byte *)0xffffffffffffffba, 3 < (long)(dstCapacity - (long)local_188))) {
    uVar24 = (long)local_168 - (long)local_120 >> 3;
    local_188 = local_188 + (long)dst;
    if (uVar24 < 0x7f) {
      *local_188 = (byte)uVar24;
      local_188 = local_188 + 1;
    }
    else if (uVar24 < 0x7f00) {
      *local_188 = (byte)(uVar24 >> 8) | 0x80;
      local_188[1] = (byte)uVar24;
      local_188 = local_188 + 2;
    }
    else {
      *local_188 = 0xff;
      *(short *)(local_188 + 1) = (short)uVar24 + -0x7f00;
      local_188 = local_188 + 3;
    }
    nextCTable = (hufTable->entropy).litlengthCTable;
    __dest = (hufTable->entropy).offcodeCTable;
    pFVar1 = (hufTable->entropy).matchlengthCTable;
    if (local_168 == local_120) {
      memcpy(nextCTable,(local_160->entropy).litlengthCTable,0x524);
      (hufTable->entropy).litlength_repeatMode = (pZVar8->entropy).litlength_repeatMode;
      memcpy(__dest,(pZVar8->entropy).offcodeCTable,0x304);
      (hufTable->entropy).offcode_repeatMode = (pZVar8->entropy).offcode_repeatMode;
      memcpy(pFVar1,(pZVar8->entropy).matchlengthCTable,0x5ac);
      (hufTable->entropy).matchlength_repeatMode = (pZVar8->entropy).matchlength_repeatMode;
      code = local_188 + -(long)dst;
    }
    else {
      local_168 = (seqDef *)((long)dst + dstCapacity);
      pbVar20 = local_188 + 1;
      local_150 = __dest;
      local_110 = pFVar1;
      ZSTD_seqToCodes(local_140);
      pBVar9 = local_128;
      max = 0x23;
      sVar28 = 0x157980;
      sVar13 = FSE_countFast_wksp(count,&max,local_128,uVar24,local_158);
      pUVar18 = local_158;
      FVar7 = (local_160->entropy).litlength_repeatMode;
      (hufTable->entropy).litlength_repeatMode = FVar7;
      FVar15 = FSE_repeat_check;
      sVar26 = set_rle;
      if (sVar13 == uVar24 && 2 < sVar13) {
LAB_001579ee:
        (hufTable->entropy).litlength_repeatMode = FVar15;
      }
      else {
        sVar26 = set_repeat;
        if (999 < uVar24 || FVar7 != FSE_repeat_valid) {
          bVar10 = uVar24 >> 5 <= sVar13 && 0x3f < uVar24;
          FVar15 = (FSE_repeat)bVar10;
          sVar26 = (uint)bVar10 + (uint)bVar10;
          goto LAB_001579ee;
        }
      }
      code = (byte *)ZSTD_buildCTable(pbVar20,(long)local_168 - (long)pbVar20,nextCTable,9,sVar26,
                                      count,max,pBVar9,uVar24,LL_defaultNorm,6,0x23,
                                      (local_160->entropy).litlengthCTable,0x524,local_158,sVar28);
      uVar22 = ZSTD_isError((size_t)code);
      if (uVar22 == 0) {
        local_140 = (seqStore_t *)CONCAT44(local_140._4_4_,sVar26);
        pbVar20 = pbVar20 + (long)code;
        max = 0x1f;
        sVar28 = 0x157a90;
        sVar13 = FSE_countFast_wksp(count,&max,local_148,uVar24,pUVar18);
        pUVar18 = local_158;
        FVar7 = (local_160->entropy).offcode_repeatMode;
        (hufTable->entropy).offcode_repeatMode = FVar7;
        if (sVar13 == uVar24) {
          FVar15 = FSE_repeat_check;
          uVar25 = 1;
          if (2 < uVar24 || 0x1c < max) goto LAB_00157c27;
LAB_00157be2:
          uVar25 = 3;
          if (999 < uVar24 || FVar7 != FSE_repeat_valid) {
            FVar15 = FSE_repeat_none;
            uVar25 = 0;
            if (uVar24 >> 4 <= sVar13 && 0x3f < uVar24) goto LAB_00157c1c;
            goto LAB_00157c27;
          }
        }
        else {
          if (max < 0x1d) goto LAB_00157be2;
LAB_00157c1c:
          uVar25 = 2;
          FVar15 = FSE_repeat_check;
LAB_00157c27:
          (hufTable->entropy).offcode_repeatMode = FVar15;
        }
        code = (byte *)ZSTD_buildCTable(pbVar20,(long)local_168 - (long)pbVar20,local_150,8,
                                        (symbolEncodingType_e)uVar25,count,max,local_148,uVar24,
                                        OF_defaultNorm,5,0x1c,(local_160->entropy).offcodeCTable,
                                        0x304,local_158,sVar28);
        uVar22 = ZSTD_isError((size_t)code);
        pBVar9 = local_130;
        if (uVar22 == 0) {
          pbVar20 = pbVar20 + (long)code;
          max = 0x34;
          sVar28 = 0x157cc5;
          local_118 = uVar25;
          sVar13 = FSE_countFast_wksp(count,&max,local_130,uVar24,pUVar18);
          pFVar1 = local_110;
          FVar7 = (local_160->entropy).matchlength_repeatMode;
          (hufTable->entropy).matchlength_repeatMode = FVar7;
          FVar15 = FSE_repeat_check;
          sVar26 = set_rle;
          if (sVar13 == uVar24 && 2 < sVar13) {
LAB_00157d43:
            (hufTable->entropy).matchlength_repeatMode = FVar15;
          }
          else {
            sVar26 = set_repeat;
            if (999 < uVar24 || FVar7 != FSE_repeat_valid) {
              bVar10 = uVar24 >> 5 <= sVar13 && 0x3f < uVar24;
              FVar15 = (FSE_repeat)bVar10;
              sVar26 = (uint)bVar10 + (uint)bVar10;
              goto LAB_00157d43;
            }
          }
          code = (byte *)ZSTD_buildCTable(pbVar20,(long)local_168 - (long)pbVar20,local_110,9,sVar26
                                          ,count,max,pBVar9,uVar24,ML_defaultNorm,6,0x34,
                                          (local_160->entropy).matchlengthCTable,0x5ac,local_158,
                                          sVar28);
          uVar22 = ZSTD_isError((size_t)code);
          if (uVar22 == 0) {
            pbVar20 = pbVar20 + (long)code;
            *local_188 = ((byte)((int)local_118 << 4) | (byte)((int)local_140 << 6)) +
                         (char)sVar26 * '\x04';
            code = (byte *)ZSTD_encodeSequences
                                     (pbVar20,(long)local_168 - (long)pbVar20,pFVar1,local_130,
                                      local_150,local_148,nextCTable,local_128,local_120,uVar24,
                                      (uint)(0x39 < uVar14),(int)local_138);
            uVar14 = ZSTD_isError((size_t)code);
            if (uVar14 == 0) {
              code = pbVar20 + ((long)code - (long)dst);
            }
          }
        }
      }
    }
  }
  if ((dstCapacity < srcSize) || (code != (byte *)0xffffffffffffffba)) {
    uVar14 = ZSTD_isError((size_t)code);
    if (uVar14 != 0) goto LAB_00157e61;
    if (code < (byte *)((srcSize - (srcSize >> 6)) + -2)) {
      if ((hufTable->entropy).offcode_repeatMode == FSE_repeat_valid) {
        (hufTable->entropy).offcode_repeatMode = FSE_repeat_check;
      }
      goto LAB_00157e61;
    }
  }
  code = (byte *)0x0;
LAB_00157e61:
  uVar14 = ZSTD_isError((size_t)code);
  if ((code != (byte *)0x0) && (uVar14 == 0)) {
    uVar2 = (zc->blockState).prevCBlock;
    uVar3 = (zc->blockState).nextCBlock;
    auVar27._8_4_ = (int)uVar2;
    auVar27._0_8_ = uVar3;
    auVar27._12_4_ = (int)((ulong)uVar2 >> 0x20);
    (zc->blockState).prevCBlock = (ZSTD_compressedBlockState_t *)uVar3;
    (zc->blockState).nextCBlock = (ZSTD_compressedBlockState_t *)auVar27._8_8_;
  }
  return (size_t)code;
}

Assistant:

static size_t ZSTD_compressBlock_internal(ZSTD_CCtx* zc,
                                        void* dst, size_t dstCapacity,
                                        const void* src, size_t srcSize)
{
    ZSTD_matchState_t* const ms = &zc->blockState.matchState;
    DEBUGLOG(5, "ZSTD_compressBlock_internal (dstCapacity=%zu, dictLimit=%u, nextToUpdate=%u)",
                dstCapacity, ms->window.dictLimit, ms->nextToUpdate);

    if (srcSize < MIN_CBLOCK_SIZE+ZSTD_blockHeaderSize+1) {
        ZSTD_ldm_skipSequences(&zc->externSeqStore, srcSize, zc->appliedParams.cParams.searchLength);
        return 0;   /* don't even attempt compression below a certain srcSize */
    }
    ZSTD_resetSeqStore(&(zc->seqStore));
    ms->opt.symbolCosts = &zc->blockState.prevCBlock->entropy;   /* required for optimal parser to read stats from dictionary */

    /* limited update after a very long match */
    {   const BYTE* const base = ms->window.base;
        const BYTE* const istart = (const BYTE*)src;
        const U32 current = (U32)(istart-base);
        if (sizeof(ptrdiff_t)==8) assert(istart - base < (ptrdiff_t)(U32)(-1));   /* ensure no overflow */
        if (current > ms->nextToUpdate + 384)
            ms->nextToUpdate = current - MIN(192, (U32)(current - ms->nextToUpdate - 384));
    }

    /* select and store sequences */
    {   U32 const extDict = ZSTD_window_hasExtDict(ms->window);
        size_t lastLLSize;
        {   int i;
            for (i = 0; i < ZSTD_REP_NUM; ++i)
                zc->blockState.nextCBlock->rep[i] = zc->blockState.prevCBlock->rep[i];
        }
        if (zc->externSeqStore.pos < zc->externSeqStore.size) {
            assert(!zc->appliedParams.ldmParams.enableLdm);
            /* Updates ldmSeqStore.pos */
            lastLLSize =
                ZSTD_ldm_blockCompress(&zc->externSeqStore,
                                       ms, &zc->seqStore,
                                       zc->blockState.nextCBlock->rep,
                                       &zc->appliedParams.cParams,
                                       src, srcSize, extDict);
            assert(zc->externSeqStore.pos <= zc->externSeqStore.size);
        } else if (zc->appliedParams.ldmParams.enableLdm) {
            rawSeqStore_t ldmSeqStore = {NULL, 0, 0, 0};

            ldmSeqStore.seq = zc->ldmSequences;
            ldmSeqStore.capacity = zc->maxNbLdmSequences;
            /* Updates ldmSeqStore.size */
            CHECK_F(ZSTD_ldm_generateSequences(&zc->ldmState, &ldmSeqStore,
                                               &zc->appliedParams.ldmParams,
                                               src, srcSize));
            /* Updates ldmSeqStore.pos */
            lastLLSize =
                ZSTD_ldm_blockCompress(&ldmSeqStore,
                                       ms, &zc->seqStore,
                                       zc->blockState.nextCBlock->rep,
                                       &zc->appliedParams.cParams,
                                       src, srcSize, extDict);
            assert(ldmSeqStore.pos == ldmSeqStore.size);
        } else {   /* not long range mode */
            ZSTD_blockCompressor const blockCompressor = ZSTD_selectBlockCompressor(zc->appliedParams.cParams.strategy, extDict);
            lastLLSize = blockCompressor(ms, &zc->seqStore, zc->blockState.nextCBlock->rep, &zc->appliedParams.cParams, src, srcSize);
        }
        {   const BYTE* const lastLiterals = (const BYTE*)src + srcSize - lastLLSize;
            ZSTD_storeLastLiterals(&zc->seqStore, lastLiterals, lastLLSize);
    }   }

    /* encode sequences and literals */
    {   size_t const cSize = ZSTD_compressSequences(&zc->seqStore,
                                &zc->blockState.prevCBlock->entropy, &zc->blockState.nextCBlock->entropy,
                                &zc->appliedParams,
                                dst, dstCapacity,
                                srcSize, zc->entropyWorkspace, zc->bmi2);
        if (ZSTD_isError(cSize) || cSize == 0) return cSize;
        /* confirm repcodes and entropy tables */
        {   ZSTD_compressedBlockState_t* const tmp = zc->blockState.prevCBlock;
            zc->blockState.prevCBlock = zc->blockState.nextCBlock;
            zc->blockState.nextCBlock = tmp;
        }
        return cSize;
    }
}